

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedProcedure.cpp
# Opt level: O0

void slang::analysis::stringifyLSP(Expression *expr,EvalContext *evalContext,FormatBuffer *buffer)

{
  int *in_RDI;
  MemberAccessExpression *access;
  RangeSelectExpression *select_1;
  ElementSelectExpression *select;
  
  (*(code *)(&DAT_00cb178c + *(int *)(&DAT_00cb178c + (ulong)(*in_RDI - 8) * 4)))();
  return;
}

Assistant:

static void stringifyLSP(const Expression& expr, EvalContext& evalContext, FormatBuffer& buffer) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            buffer.append(expr.as<ValueExpressionBase>().symbol.name);
            break;
        case ExpressionKind::Conversion:
            stringifyLSP(expr.as<ConversionExpression>().operand(), evalContext, buffer);
            break;
        case ExpressionKind::ElementSelect: {
            auto& select = expr.as<ElementSelectExpression>();
            stringifyLSP(select.value(), evalContext, buffer);
            buffer.format("[{}]", select.selector().eval(evalContext).toString());
            break;
        }
        case ExpressionKind::RangeSelect: {
            auto& select = expr.as<RangeSelectExpression>();
            stringifyLSP(select.value(), evalContext, buffer);
            buffer.format("[{}:{}]", select.left().eval(evalContext).toString(),
                          select.right().eval(evalContext).toString());
            break;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = expr.as<MemberAccessExpression>();
            stringifyLSP(access.value(), evalContext, buffer);
            buffer.append(".");
            buffer.append(access.member.name);
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }
}